

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool absl::debugging_internal::MaybeAppend(State *state,char *str)

{
  size_t sVar1;
  int length;
  char *str_local;
  State *state_local;
  
  if (*(int *)&(state->parse_state).field_0xc < 0) {
    sVar1 = StrLen(str);
    MaybeAppendWithLength(state,str,(int)sVar1);
  }
  return true;
}

Assistant:

static bool MaybeAppend(State *state, const char *const str) {
  if (state->parse_state.append) {
    int length = StrLen(str);
    MaybeAppendWithLength(state, str, length);
  }
  return true;
}